

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomSlots::read(DomSlots *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  QStringList *this_00;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar3.m_data = L"signal";
        QVar3.m_size = 6;
        iVar1 = QtPrivate::compareStrings(local_48,QVar3,CaseInsensitive);
        if (iVar1 == 0) {
          QXmlStreamReader::readElementText(&local_60,pQVar2,0);
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)&this->m_signal,(this->m_signal).d.size,&local_60)
          ;
          this_00 = &this->m_signal;
LAB_00157cb7:
          QList<QString>::end(this_00);
        }
        else {
          QVar4.m_data = L"slot";
          QVar4.m_size = 4;
          iVar1 = QtPrivate::compareStrings(local_48,QVar4,CaseInsensitive);
          if (iVar1 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar2,0);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)&this->m_slot,(this->m_slot).d.size,&local_60);
            this_00 = &this->m_slot;
            goto LAB_00157cb7;
          }
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError(pQVar2);
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomSlots::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"signal"_s, Qt::CaseInsensitive)) {
                m_signal.append(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"slot"_s, Qt::CaseInsensitive)) {
                m_slot.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}